

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O0

events_output_state __thiscall E64::host_t::events_process_events(host_t *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long in_RDI;
  bool alt_pressed;
  SDL_Event event;
  events_output_state return_value;
  undefined4 in_stack_ffffffffffffffa0;
  int local_48 [5];
  int local_34;
  SDL_KeyCode in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  events_output_state eVar5;
  
  eVar5 = NO_EVENT;
  bVar2 = *(char *)(*(long *)(in_RDI + 200) + 0xe2) != '\0';
  bVar3 = *(char *)(*(long *)(in_RDI + 200) + 0xe6) != '\0';
  while (iVar4 = SDL_PollEvent(local_48), iVar4 != 0) {
    if (local_48[0] == 0x100) {
      eVar5 = QUIT_EVENT;
    }
    else if (local_48[0] == 0x300) {
      eVar5 = KEYPRESS_EVENT;
      if ((local_34 == 0x66) && (bVar2 || bVar3)) {
        iVar4 = local_48[0];
        events_wait_until_key_released
                  ((host_t *)CONCAT44(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
        video_toggle_fullscreen((host_t *)CONCAT44(iVar4,in_stack_ffffffffffffffa0));
      }
      else if ((local_34 == 0x73) && (bVar2 || bVar3)) {
        video_change_scanlines_intensity((host_t *)CONCAT44(0x300,in_stack_ffffffffffffffa0));
      }
      else if ((local_34 == 0x62) && (bVar2 || bVar3)) {
        video_toggle_linear_filtering((host_t *)CONCAT44(0x300,in_stack_ffffffffffffffa0));
      }
      else if ((local_34 == 0x72) && (bVar2 || bVar3)) {
        events_wait_until_key_released
                  ((host_t *)CONCAT44(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
        hud_t::show_notification(*(hud_t **)(in_RDI + 0xd0),"\nResetting system");
      }
      else if ((local_34 == 0x71) && (bVar2 || bVar3)) {
        events_wait_until_key_released
                  ((host_t *)CONCAT44(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
        eVar5 = QUIT_EVENT;
      }
      else if ((local_34 == 0x2d) && (bVar2 || bVar3)) {
        iVar4 = local_48[0];
        events_wait_until_key_released
                  ((host_t *)CONCAT44(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
        video_decrease_window_size((host_t *)CONCAT44(iVar4,in_stack_ffffffffffffffa0));
      }
      else if ((local_34 == 0x3d) && (bVar2 || bVar3)) {
        iVar4 = local_48[0];
        events_wait_until_key_released
                  ((host_t *)CONCAT44(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
        video_increase_window_size((host_t *)CONCAT44(iVar4,in_stack_ffffffffffffffa0));
      }
      else if (local_34 == 0x40000043) {
        hud_t::toggle_stats(*(hud_t **)(in_RDI + 0xd0));
      }
      else if ((local_34 == 0x77) && (bVar2 || bVar3)) {
        iVar4 = local_48[0];
        if ((*(byte *)(*(long *)(in_RDI + 0xd8) + 0x253) & 1) == 0) {
          hud_t::show_notification(*(hud_t **)(in_RDI + 0xd0),"\nStart recording sound");
        }
        else {
          hud_t::show_notification(*(hud_t **)(in_RDI + 0xd0),"\nStop recording sound");
        }
        settings_t::audio_toggle_recording((settings_t *)CONCAT44(iVar4,in_stack_ffffffffffffffa0));
      }
    }
  }
  if (!bVar2 && !bVar3) {
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x29);
    *(char *)(in_RDI + 0xe9) = *(char *)(in_RDI + 0xe9) << 1;
    *(byte *)(in_RDI + 0xe9) = *(byte *)(in_RDI + 0xe9) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x3a);
    *(char *)(in_RDI + 0xea) = *(char *)(in_RDI + 0xea) << 1;
    *(byte *)(in_RDI + 0xea) = *(byte *)(in_RDI + 0xea) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x3b);
    *(char *)(in_RDI + 0xeb) = *(char *)(in_RDI + 0xeb) << 1;
    *(byte *)(in_RDI + 0xeb) = *(byte *)(in_RDI + 0xeb) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x3c);
    *(char *)(in_RDI + 0xec) = *(char *)(in_RDI + 0xec) << 1;
    *(byte *)(in_RDI + 0xec) = *(byte *)(in_RDI + 0xec) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x3d);
    *(char *)(in_RDI + 0xed) = *(char *)(in_RDI + 0xed) << 1;
    *(byte *)(in_RDI + 0xed) = *(byte *)(in_RDI + 0xed) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x3e);
    *(char *)(in_RDI + 0xee) = *(char *)(in_RDI + 0xee) << 1;
    *(byte *)(in_RDI + 0xee) = *(byte *)(in_RDI + 0xee) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x3f);
    *(char *)(in_RDI + 0xef) = *(char *)(in_RDI + 0xef) << 1;
    *(byte *)(in_RDI + 0xef) = *(byte *)(in_RDI + 0xef) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x40);
    *(char *)(in_RDI + 0xf0) = *(char *)(in_RDI + 0xf0) << 1;
    *(byte *)(in_RDI + 0xf0) = *(byte *)(in_RDI + 0xf0) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x41);
    *(char *)(in_RDI + 0xf1) = *(char *)(in_RDI + 0xf1) << 1;
    *(byte *)(in_RDI + 0xf1) = *(byte *)(in_RDI + 0xf1) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x35);
    *(char *)(in_RDI + 0xf2) = *(char *)(in_RDI + 0xf2) << 1;
    *(byte *)(in_RDI + 0xf2) = *(byte *)(in_RDI + 0xf2) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x1e);
    *(char *)(in_RDI + 0xf3) = *(char *)(in_RDI + 0xf3) << 1;
    *(byte *)(in_RDI + 0xf3) = *(byte *)(in_RDI + 0xf3) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x1f);
    *(char *)(in_RDI + 0xf4) = *(char *)(in_RDI + 0xf4) << 1;
    *(byte *)(in_RDI + 0xf4) = *(byte *)(in_RDI + 0xf4) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x20);
    *(char *)(in_RDI + 0xf5) = *(char *)(in_RDI + 0xf5) << 1;
    *(byte *)(in_RDI + 0xf5) = *(byte *)(in_RDI + 0xf5) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x21);
    *(char *)(in_RDI + 0xf6) = *(char *)(in_RDI + 0xf6) << 1;
    *(byte *)(in_RDI + 0xf6) = *(byte *)(in_RDI + 0xf6) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x22);
    *(char *)(in_RDI + 0xf7) = *(char *)(in_RDI + 0xf7) << 1;
    *(byte *)(in_RDI + 0xf7) = *(byte *)(in_RDI + 0xf7) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x23);
    *(char *)(in_RDI + 0xf8) = *(char *)(in_RDI + 0xf8) << 1;
    *(byte *)(in_RDI + 0xf8) = *(byte *)(in_RDI + 0xf8) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x24);
    *(char *)(in_RDI + 0xf9) = *(char *)(in_RDI + 0xf9) << 1;
    *(byte *)(in_RDI + 0xf9) = *(byte *)(in_RDI + 0xf9) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x25);
    *(char *)(in_RDI + 0xfa) = *(char *)(in_RDI + 0xfa) << 1;
    *(byte *)(in_RDI + 0xfa) = *(byte *)(in_RDI + 0xfa) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x26);
    *(char *)(in_RDI + 0xfb) = *(char *)(in_RDI + 0xfb) << 1;
    *(byte *)(in_RDI + 0xfb) = *(byte *)(in_RDI + 0xfb) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x27);
    *(char *)(in_RDI + 0xfc) = *(char *)(in_RDI + 0xfc) << 1;
    *(byte *)(in_RDI + 0xfc) = *(byte *)(in_RDI + 0xfc) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x2d);
    *(char *)(in_RDI + 0xfd) = *(char *)(in_RDI + 0xfd) << 1;
    *(byte *)(in_RDI + 0xfd) = *(byte *)(in_RDI + 0xfd) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x2e);
    *(char *)(in_RDI + 0xfe) = *(char *)(in_RDI + 0xfe) << 1;
    *(byte *)(in_RDI + 0xfe) = *(byte *)(in_RDI + 0xfe) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x2a);
    *(char *)(in_RDI + 0xff) = *(char *)(in_RDI + 0xff) << 1;
    *(byte *)(in_RDI + 0xff) = *(byte *)(in_RDI + 0xff) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x2b);
    *(char *)(in_RDI + 0x100) = *(char *)(in_RDI + 0x100) << 1;
    *(byte *)(in_RDI + 0x100) = *(byte *)(in_RDI + 0x100) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x14);
    *(char *)(in_RDI + 0x101) = *(char *)(in_RDI + 0x101) << 1;
    *(byte *)(in_RDI + 0x101) = *(byte *)(in_RDI + 0x101) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x1a);
    *(char *)(in_RDI + 0x102) = *(char *)(in_RDI + 0x102) << 1;
    *(byte *)(in_RDI + 0x102) = *(byte *)(in_RDI + 0x102) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 8);
    *(char *)(in_RDI + 0x103) = *(char *)(in_RDI + 0x103) << 1;
    *(byte *)(in_RDI + 0x103) = *(byte *)(in_RDI + 0x103) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x15);
    *(char *)(in_RDI + 0x104) = *(char *)(in_RDI + 0x104) << 1;
    *(byte *)(in_RDI + 0x104) = *(byte *)(in_RDI + 0x104) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x17);
    *(char *)(in_RDI + 0x105) = *(char *)(in_RDI + 0x105) << 1;
    *(byte *)(in_RDI + 0x105) = *(byte *)(in_RDI + 0x105) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x1c);
    *(char *)(in_RDI + 0x106) = *(char *)(in_RDI + 0x106) << 1;
    *(byte *)(in_RDI + 0x106) = *(byte *)(in_RDI + 0x106) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x18);
    *(char *)(in_RDI + 0x107) = *(char *)(in_RDI + 0x107) << 1;
    *(byte *)(in_RDI + 0x107) = *(byte *)(in_RDI + 0x107) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xc);
    *(char *)(in_RDI + 0x108) = *(char *)(in_RDI + 0x108) << 1;
    *(byte *)(in_RDI + 0x108) = *(byte *)(in_RDI + 0x108) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x12);
    *(char *)(in_RDI + 0x109) = *(char *)(in_RDI + 0x109) << 1;
    *(byte *)(in_RDI + 0x109) = *(byte *)(in_RDI + 0x109) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x13);
    *(char *)(in_RDI + 0x10a) = *(char *)(in_RDI + 0x10a) << 1;
    *(byte *)(in_RDI + 0x10a) = *(byte *)(in_RDI + 0x10a) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x2f);
    *(char *)(in_RDI + 0x10b) = *(char *)(in_RDI + 0x10b) << 1;
    *(byte *)(in_RDI + 0x10b) = *(byte *)(in_RDI + 0x10b) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x30);
    *(char *)(in_RDI + 0x10c) = *(char *)(in_RDI + 0x10c) << 1;
    *(byte *)(in_RDI + 0x10c) = *(byte *)(in_RDI + 0x10c) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x28);
    *(char *)(in_RDI + 0x10d) = *(char *)(in_RDI + 0x10d) << 1;
    *(byte *)(in_RDI + 0x10d) = *(byte *)(in_RDI + 0x10d) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 4);
    *(char *)(in_RDI + 0x10e) = *(char *)(in_RDI + 0x10e) << 1;
    *(byte *)(in_RDI + 0x10e) = *(byte *)(in_RDI + 0x10e) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x16);
    *(char *)(in_RDI + 0x10f) = *(char *)(in_RDI + 0x10f) << 1;
    *(byte *)(in_RDI + 0x10f) = *(byte *)(in_RDI + 0x10f) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 7);
    *(char *)(in_RDI + 0x110) = *(char *)(in_RDI + 0x110) << 1;
    *(byte *)(in_RDI + 0x110) = *(byte *)(in_RDI + 0x110) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 9);
    *(char *)(in_RDI + 0x111) = *(char *)(in_RDI + 0x111) << 1;
    *(byte *)(in_RDI + 0x111) = *(byte *)(in_RDI + 0x111) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 10);
    *(char *)(in_RDI + 0x112) = *(char *)(in_RDI + 0x112) << 1;
    *(byte *)(in_RDI + 0x112) = *(byte *)(in_RDI + 0x112) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xb);
    *(char *)(in_RDI + 0x113) = *(char *)(in_RDI + 0x113) << 1;
    *(byte *)(in_RDI + 0x113) = *(byte *)(in_RDI + 0x113) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xd);
    *(char *)(in_RDI + 0x114) = *(char *)(in_RDI + 0x114) << 1;
    *(byte *)(in_RDI + 0x114) = *(byte *)(in_RDI + 0x114) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xe);
    *(char *)(in_RDI + 0x115) = *(char *)(in_RDI + 0x115) << 1;
    *(byte *)(in_RDI + 0x115) = *(byte *)(in_RDI + 0x115) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xf);
    *(char *)(in_RDI + 0x116) = *(char *)(in_RDI + 0x116) << 1;
    *(byte *)(in_RDI + 0x116) = *(byte *)(in_RDI + 0x116) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x33);
    *(char *)(in_RDI + 0x117) = *(char *)(in_RDI + 0x117) << 1;
    *(byte *)(in_RDI + 0x117) = *(byte *)(in_RDI + 0x117) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x34);
    *(char *)(in_RDI + 0x118) = *(char *)(in_RDI + 0x118) << 1;
    *(byte *)(in_RDI + 0x118) = *(byte *)(in_RDI + 0x118) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x31);
    *(char *)(in_RDI + 0x119) = *(char *)(in_RDI + 0x119) << 1;
    *(byte *)(in_RDI + 0x119) = *(byte *)(in_RDI + 0x119) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xe1);
    *(char *)(in_RDI + 0x11a) = *(char *)(in_RDI + 0x11a) << 1;
    *(byte *)(in_RDI + 0x11a) = *(byte *)(in_RDI + 0x11a) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x1d);
    *(char *)(in_RDI + 0x11b) = *(char *)(in_RDI + 0x11b) << 1;
    *(byte *)(in_RDI + 0x11b) = *(byte *)(in_RDI + 0x11b) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x1b);
    *(char *)(in_RDI + 0x11c) = *(char *)(in_RDI + 0x11c) << 1;
    *(byte *)(in_RDI + 0x11c) = *(byte *)(in_RDI + 0x11c) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 6);
    *(char *)(in_RDI + 0x11d) = *(char *)(in_RDI + 0x11d) << 1;
    *(byte *)(in_RDI + 0x11d) = *(byte *)(in_RDI + 0x11d) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x19);
    *(char *)(in_RDI + 0x11e) = *(char *)(in_RDI + 0x11e) << 1;
    *(byte *)(in_RDI + 0x11e) = *(byte *)(in_RDI + 0x11e) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 5);
    *(char *)(in_RDI + 0x11f) = *(char *)(in_RDI + 0x11f) << 1;
    *(byte *)(in_RDI + 0x11f) = *(byte *)(in_RDI + 0x11f) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x11);
    *(char *)(in_RDI + 0x120) = *(char *)(in_RDI + 0x120) << 1;
    *(byte *)(in_RDI + 0x120) = *(byte *)(in_RDI + 0x120) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x10);
    *(char *)(in_RDI + 0x121) = *(char *)(in_RDI + 0x121) << 1;
    *(byte *)(in_RDI + 0x121) = *(byte *)(in_RDI + 0x121) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x36);
    *(char *)(in_RDI + 0x122) = *(char *)(in_RDI + 0x122) << 1;
    *(byte *)(in_RDI + 0x122) = *(byte *)(in_RDI + 0x122) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x37);
    *(char *)(in_RDI + 0x123) = *(char *)(in_RDI + 0x123) << 1;
    *(byte *)(in_RDI + 0x123) = *(byte *)(in_RDI + 0x123) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x38);
    *(char *)(in_RDI + 0x124) = *(char *)(in_RDI + 0x124) << 1;
    *(byte *)(in_RDI + 0x124) = *(byte *)(in_RDI + 0x124) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xe5);
    *(char *)(in_RDI + 0x125) = *(char *)(in_RDI + 0x125) << 1;
    *(byte *)(in_RDI + 0x125) = *(byte *)(in_RDI + 0x125) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xe0);
    *(char *)(in_RDI + 0x126) = *(char *)(in_RDI + 0x126) << 1;
    *(byte *)(in_RDI + 0x126) = *(byte *)(in_RDI + 0x126) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x2c);
    *(char *)(in_RDI + 0x127) = *(char *)(in_RDI + 0x127) << 1;
    *(byte *)(in_RDI + 0x127) = *(byte *)(in_RDI + 0x127) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0xe4);
    *(char *)(in_RDI + 0x128) = *(char *)(in_RDI + 0x128) << 1;
    *(byte *)(in_RDI + 0x128) = *(byte *)(in_RDI + 0x128) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x50);
    *(char *)(in_RDI + 0x129) = *(char *)(in_RDI + 0x129) << 1;
    *(byte *)(in_RDI + 0x129) = *(byte *)(in_RDI + 0x129) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x52);
    *(char *)(in_RDI + 0x12a) = *(char *)(in_RDI + 0x12a) << 1;
    *(byte *)(in_RDI + 0x12a) = *(byte *)(in_RDI + 0x12a) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x51);
    *(char *)(in_RDI + 299) = *(char *)(in_RDI + 299) << 1;
    *(byte *)(in_RDI + 299) = *(byte *)(in_RDI + 299) | cVar1 != '\0';
    cVar1 = *(char *)(*(long *)(in_RDI + 200) + 0x4f);
    *(char *)(in_RDI + 300) = *(char *)(in_RDI + 300) << 1;
    *(byte *)(in_RDI + 300) = *(byte *)(in_RDI + 300) | cVar1 != '\0';
  }
  if (eVar5 == QUIT_EVENT) {
    printf("[SDL] detected quit event\n");
  }
  return eVar5;
}

Assistant:

enum E64::events_output_state E64::host_t::events_process_events()
{
	enum events_output_state return_value = NO_EVENT;
	
	SDL_Event event;
	
	//bool shift_pressed = E64_sdl2_keyboard_state[SDL_SCANCODE_LSHIFT] | E64_sdl2_keyboard_state[SDL_SCANCODE_RSHIFT];
	bool alt_pressed = sdl_keyboard_state[SDL_SCANCODE_LALT] | sdl_keyboard_state[SDL_SCANCODE_RALT];
	//bool gui_pressed   = E64_sdl2_keyboard_state[SDL_SCANCODE_LGUI] | E64_sdl2_keyboard_state[SDL_SCANCODE_RGUI];
	
	while (SDL_PollEvent(&event)) {
		switch(event.type) {
			case SDL_KEYDOWN:
				return_value = KEYPRESS_EVENT;
				if( (event.key.keysym.sym == SDLK_f) && alt_pressed ) {
					events_wait_until_key_released(SDLK_f);
					video_toggle_fullscreen();
				} else if( (event.key.keysym.sym == SDLK_s) && alt_pressed ) {
					video_change_scanlines_intensity();
				} else if ((event.key.keysym.sym == SDLK_b) && alt_pressed) {
					video_toggle_linear_filtering();
				} else if ((event.key.keysym.sym == SDLK_r) && alt_pressed) {
					events_wait_until_key_released(SDLK_r);
					hud->show_notification("\nResetting system");
				} else if( (event.key.keysym.sym == SDLK_q) && alt_pressed ) {
					events_wait_until_key_released(SDLK_q);
					return_value = QUIT_EVENT;
				} else if ((event.key.keysym.sym == SDLK_MINUS) && alt_pressed) {
					// decrease screen size
					events_wait_until_key_released(SDLK_MINUS);
					video_decrease_window_size();
				} else if ((event.key.keysym.sym == SDLK_EQUALS) && alt_pressed) {
					// decrease screen size
					events_wait_until_key_released(SDLK_EQUALS);
					video_increase_window_size();
				} else if(event.key.keysym.sym == SDLK_F10) {
					hud->toggle_stats();
				} else if((event.key.keysym.sym == SDLK_w) && alt_pressed) {
					// TODO: does this always work?
					if (settings->audio_recording) {
						hud->show_notification("\nStop recording sound");
					} else {
						hud->show_notification("\nStart recording sound");
					}
					settings->audio_toggle_recording();
				}
				break;
			case SDL_QUIT:
				return_value = QUIT_EVENT;
				break;
		}
	}

	if (!alt_pressed) {
		(keyboard_state[SCANCODE_ESCAPE      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_ESCAPE      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F1          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F1          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F2          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F2          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F3          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F3          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F4          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F4          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F5          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F5          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F6          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F6          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F7          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F7          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F8          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F8          ] ? 0b1 : 0b0;
		// TODO: what was different here in old E64?
		(keyboard_state[SCANCODE_GRAVE       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_GRAVE       ] ? 0b1 : 0b0;
		//
		(keyboard_state[SCANCODE_1           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_1           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_2           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_2           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_3           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_3           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_4           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_4           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_5           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_5           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_6           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_6           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_7           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_7           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_8           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_8           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_9           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_9           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_0           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_0           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_MINUS       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_MINUS       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_EQUALS      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_EQUALS      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_BACKSPACE   ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_BACKSPACE   ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_TAB         ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_TAB         ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_Q           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_Q           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_W           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_W           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_E           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_E           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_R           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_R           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_T           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_T           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_Y           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_Y           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_U           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_U           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_I           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_I           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_O           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_O           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_P           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_P           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LEFTBRACKET ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LEFTBRACKET ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RIGHTBRACKET] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RIGHTBRACKET] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RETURN      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RETURN      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_A           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_A           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_S           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_S           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_D           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_D           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_G           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_G           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_H           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_H           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_J           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_J           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_K           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_K           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_L           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_L           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_SEMICOLON   ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_SEMICOLON   ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_APOSTROPHE  ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_APOSTROPHE  ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_BACKSLASH   ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_BACKSLASH   ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LSHIFT      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LSHIFT      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_Z           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_Z           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_X           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_X           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_C           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_C           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_V           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_V           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_B           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_B           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_N           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_N           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_M           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_M           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_COMMA       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_COMMA       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_PERIOD      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_PERIOD      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_SLASH       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_SLASH       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RSHIFT      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RSHIFT      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LCTRL       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LCTRL       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_SPACE       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_SPACE       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RCTRL       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RCTRL       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LEFT        ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LEFT        ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_UP          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_UP          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_DOWN        ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_DOWN        ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RIGHT       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RIGHT       ] ? 0b1 : 0b0;
	};
	
	if (return_value == QUIT_EVENT) printf("[SDL] detected quit event\n");
	return return_value;
}